

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O3

void pzshape::TPZShapeTetra::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int ord;
  double *pdVar9;
  long *plVar10;
  long lVar11;
  bool bVar12;
  uint uVar13;
  int transformation_index;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int (*paiVar20) [3];
  int xj_1;
  long lVar21;
  TPZVec<double> *pt_00;
  int xj;
  long lVar22;
  int xj_2;
  uint uVar23;
  long lVar24;
  int64_t size;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar30 [16];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  TPZVec<long> ids;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  REAL store2 [60];
  REAL store1 [20];
  long local_1028;
  long local_1018;
  long local_fe0;
  TPZVec<double> local_fa8;
  double local_f88 [2];
  TPZFMatrix<double> local_f78;
  TPZVec<long> *local_ee8;
  TPZFMatrix<double> local_ee0;
  _func_int **local_e50;
  TPZManVector<long,_10> local_e48;
  TPZFMatrix<double> local_dd8;
  double local_d48 [101];
  TPZFMatrix<double> local_a20;
  double local_990 [101];
  undefined1 local_668 [88];
  int local_610 [6];
  undefined **local_5f8;
  undefined1 local_5f0 [16];
  int64_t local_5e0;
  double local_5d8 [82];
  undefined1 local_348 [88];
  int local_2f0 [6];
  undefined **local_2d8;
  undefined1 local_2d0 [16];
  int64_t local_2c0;
  double local_2b8 [81];
  
  local_ee8 = id;
  CornerShape(pt,phi,dphi);
  bVar12 = true;
  lVar18 = 0;
  do {
    bVar12 = (bool)(bVar12 & order->fStore[lVar18] < 2);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xb);
  if (!bVar12) {
    local_dd8.fElem = local_d48;
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xf;
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_dd8.fSize = 100;
    local_dd8.fGiven = local_dd8.fElem;
    TPZVec<int>::TPZVec(&local_dd8.fPivot.super_TPZVec<int>,0);
    local_dd8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_dd8.fPivot.super_TPZVec<int>.fStore = local_dd8.fPivot.fExtAlloc;
    local_dd8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_dd8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_dd8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_dd8.fWork.fStore = (double *)0x0;
    local_dd8.fWork.fNElements = 0;
    local_dd8.fWork.fNAlloc = 0;
    local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_a20.fElem = local_990;
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0xf;
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_a20.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_a20.fPivot;
    local_a20.fGiven = local_a20.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_a20.fPivot.super_TPZVec<int>.fStore = local_a20.fPivot.fExtAlloc;
    local_a20.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_a20.fPivot.super_TPZVec<int>.fNElements = 0;
    local_a20.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_a20.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_a20.fWork.fStore = (double *)0x0;
    local_a20.fWork.fNElements = 0;
    local_a20.fWork.fNAlloc = 0;
    local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    lVar18 = 0;
    lVar24 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar24) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
         (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_dd8.fElem[lVar24] = phi->fElem[lVar24];
      lVar21 = 0;
      do {
        lVar19 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar19 <= lVar21) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar24)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) ||
           (local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar24)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_a20.fElem +
         lVar21 * 8 + local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar18) =
             *(undefined8 *)((long)dphi->fElem + lVar21 * 8 + lVar19 * lVar18);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      lVar24 = lVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (lVar24 != 4);
    ShapeGenerating(pt_00,&local_dd8,&local_a20);
    local_1028 = 4;
    local_fe0 = 0x20;
    local_e50 = (_func_int **)&PTR__TPZManVector_018b7c18;
    lVar18 = 0;
    do {
      pdVar9 = pt->fStore;
      dVar1 = (double)(&gRibTrans3dTetra1d)[lVar18 * 3];
      dVar2 = (double)(&DAT_01a30cd8)[lVar18 * 3];
      dVar3 = pdVar9[1];
      dVar4 = *pdVar9;
      dVar5 = (double)(&DAT_01a30ce0)[lVar18 * 3];
      dVar6 = pdVar9[2];
      dVar7 = (double)(&gRibSum3dTetra1d)[lVar18];
      TPZVec<long>::TPZVec((TPZVec<long> *)&local_fa8,2);
      TPZVec<double>::TPZVec((TPZVec<double> *)&local_e48,0);
      local_e48.super_TPZVec<long>._vptr_TPZVec = local_e50;
      local_e48.super_TPZVec<long>.fNElements = 1;
      local_e48.super_TPZVec<long>.fNAlloc = 0;
      iVar8 = pztopology::TPZTetrahedron::SideNodes[lVar18][1];
      plVar10 = local_ee8->fStore;
      *local_fa8.fStore = (double)plVar10[pztopology::TPZTetrahedron::SideNodes[lVar18][0]];
      local_fa8.fStore[1] = (double)plVar10[iVar8];
      iVar15 = order->fStore[lVar18];
      iVar8 = iVar15 + -1;
      uVar17 = (ulong)iVar8;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_ee0.fElem = (double *)local_348;
      local_ee0.fSize = 0x14;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar17;
      local_ee0.fGiven = local_ee0.fElem;
      local_e48.super_TPZVec<long>.fStore = local_e48.fExtAlloc;
      local_e48.fExtAlloc[0] = (long)(dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3 + dVar7);
      TPZVec<int>::TPZVec(&local_ee0.fPivot.super_TPZVec<int>,0);
      local_ee0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_ee0.fPivot.super_TPZVec<int>.fStore = local_ee0.fPivot.fExtAlloc;
      local_ee0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_ee0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_ee0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_ee0.fWork.fStore = (double *)0x0;
      local_ee0.fWork.fNElements = 0;
      local_ee0.fWork.fNAlloc = 0;
      if (iVar8 == 0) {
        local_ee0.fElem = (double *)0x0;
      }
      else if (0x15 < iVar15) {
        local_ee0.fElem = (double *)operator_new__(uVar17 * 8);
      }
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_f78.fElem = (double *)local_668;
      local_f78.fSize = 0x3c;
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar17;
      local_f78.fGiven = local_f78.fElem;
      TPZVec<int>::TPZVec(&local_f78.fPivot.super_TPZVec<int>,0);
      local_f78.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_f78.fPivot.super_TPZVec<int>.fStore = local_f78.fPivot.fExtAlloc;
      local_f78.fPivot.super_TPZVec<int>.fNElements = 0;
      local_f78.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_f78.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_f78.fWork.fStore = (double *)0x0;
      local_f78.fWork.fNElements = 0;
      local_f78.fWork.fNAlloc = 0;
      if (iVar8 == 0) {
        local_f78.fElem = (double *)0x0;
      }
      else if (0x15 < iVar15) {
        local_f78.fElem = (double *)operator_new__(uVar17 * 0x18);
      }
      memset(local_ee0.fElem,0,
             local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_f78.fElem,0,
             local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      ord = order->fStore[lVar18];
      transformation_index = TPZShapeLinear::GetTransformId1d((TPZVec<long> *)&local_fa8);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)&local_e48,ord,&local_ee0,&local_f78,transformation_index);
      TransformDerivativeFromRibToTetra((int)lVar18,iVar8,&local_f78);
      if (1 < iVar15) {
        lVar21 = lVar18 + 4;
        local_1028 = (long)(int)local_1028;
        lVar24 = local_1028 * 8;
        lVar19 = 0;
        uVar25 = 0;
        do {
          if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) ||
             (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar25) ||
             (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_1028 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1028)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_1028] = local_dd8.fElem[lVar18 + 4] * local_ee0.fElem[uVar25];
          lVar22 = 0;
          do {
            if ((local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar21)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar25) ||
               (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) ||
               (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar11 <= lVar22) || (local_1028 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1028)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)((long)dphi->fElem + lVar22 * 8 + lVar11 * lVar24) =
                 *(double *)
                  ((long)local_a20.fElem +
                  lVar22 * 8 +
                  local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_fe0) *
                 local_ee0.fElem[uVar25] +
                 local_dd8.fElem[lVar18 + 4] *
                 *(double *)
                  ((long)local_f78.fElem +
                  lVar22 * 8 + local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          local_1028 = local_1028 + 1;
          uVar25 = uVar25 + 1;
          lVar19 = lVar19 + 8;
          lVar24 = lVar24 + 8;
        } while (uVar25 != uVar17);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_f78);
      TPZFMatrix<double>::~TPZFMatrix(&local_ee0);
      if (local_e48.super_TPZVec<long>.fStore != local_e48.fExtAlloc) {
        local_e48.super_TPZVec<long>.fNAlloc = 0;
        local_e48.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_e48.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_e48.super_TPZVec<long>.fStore);
        }
      }
      local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_fa8.fStore != (double *)0x0) {
        operator_delete__(local_fa8.fStore);
      }
      lVar18 = lVar18 + 1;
      local_fe0 = local_fe0 + 8;
    } while (lVar18 != 6);
    paiVar20 = pztopology::TPZTetrahedron::FaceNodes;
    local_1018 = 0x50;
    lVar18 = 0;
    do {
      if (2 < order->fStore[lVar18 + 6]) {
        TPZVec<double>::TPZVec(&local_fa8,0);
        local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c090;
        local_fa8.fStore = local_f88;
        local_fa8.fNElements = 2;
        local_fa8.fNAlloc = 0;
        ProjectPoint3dTetraToFace((int)lVar18,pt,&local_fa8);
        iVar8 = order->fStore[lVar18 + 6];
        if (2 < iVar8) {
          uVar23 = (iVar8 + -1) * (iVar8 + -2);
          uVar14 = uVar23 >> 1;
          uVar17 = (ulong)uVar14;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018151d8;
          local_ee0.fElem = (double *)local_348;
          local_ee0.fSize = 0x14;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar17;
          local_ee0.fGiven = local_ee0.fElem;
          TPZVec<int>::TPZVec(&local_ee0.fPivot.super_TPZVec<int>,0);
          local_ee0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_ee0.fPivot.super_TPZVec<int>.fStore = local_ee0.fPivot.fExtAlloc;
          local_ee0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_ee0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_ee0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_ee0.fWork.fStore = (double *)0x0;
          local_ee0.fWork.fNElements = 0;
          local_ee0.fWork.fNAlloc = 0;
          if (0x29 < uVar23) {
            local_ee0.fElem = (double *)operator_new__(uVar17 * 8);
          }
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018151d8;
          local_f78.fElem = (double *)local_668;
          local_f78.fSize = 0x3c;
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar17;
          local_f78.fGiven = local_f78.fElem;
          TPZVec<int>::TPZVec(&local_f78.fPivot.super_TPZVec<int>,0);
          local_f78.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_f78.fPivot.super_TPZVec<int>.fStore = local_f78.fPivot.fExtAlloc;
          local_f78.fPivot.super_TPZVec<int>.fNElements = 0;
          local_f78.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_f78.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_f78.fWork.fStore = (double *)0x0;
          local_f78.fWork.fNElements = 0;
          local_f78.fWork.fNAlloc = 0;
          if (0x29 < uVar23) {
            local_f78.fElem = (double *)operator_new__(uVar17 * 0x18);
          }
          memset(local_ee0.fElem,0,
                 local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          memset(local_f78.fElem,0,
                 local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          TPZManVector<long,_10>::TPZManVector(&local_e48,3);
          plVar10 = local_ee8->fStore;
          lVar24 = 0;
          do {
            local_e48.super_TPZVec<long>.fStore[lVar24] = plVar10[(*paiVar20)[lVar24]];
            lVar24 = lVar24 + 1;
          } while (lVar24 != 3);
          iVar15 = TPZShapeTriang::GetTransformId2dT(&local_e48.super_TPZVec<long>);
          *local_fa8.fStore = (*local_fa8.fStore + 1.0) * 0.5;
          local_fa8.fStore[1] = (local_fa8.fStore[1] + 1.0) * 0.5;
          TPZShapeTriang::ShapeInternal(&local_fa8,iVar8 + -2,&local_ee0,&local_f78,iVar15);
          if (0 < (int)(uint)local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) {
            uVar25 = 0;
            do {
              if ((local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar24 = local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar25;
              local_f78.fElem[lVar24] = local_f78.fElem[lVar24] * 0.5;
              if ((local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_f78.fElem[lVar24 + 1] = local_f78.fElem[lVar24 + 1] * 0.5;
              if ((local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
                 (local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_f78.fElem[lVar24 + 2] = local_f78.fElem[lVar24 + 2] * 0.5;
              uVar25 = uVar25 + 1;
            } while (((uint)local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol & 0x7fffffff)
                     != uVar25);
          }
          TransformDerivativeFromFaceToTetra((int)lVar18,uVar14,&local_f78);
          if (1 < uVar23) {
            lVar24 = lVar18 + 10;
            if (uVar14 < 2) {
              uVar17 = 1;
            }
            local_1028 = (long)(int)local_1028;
            lVar21 = local_1028 * 8;
            lVar19 = 0;
            uVar25 = 0;
            do {
              if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
                 (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar25) ||
                 (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_1028 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1028)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_1028] = local_dd8.fElem[lVar18 + 10] * local_ee0.fElem[uVar25];
              lVar22 = 0;
              do {
                if ((local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                   (local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar24)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar25) ||
                   (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
                   (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                   (local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                if (((lVar11 <= lVar22) || (local_1028 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1028)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)((long)dphi->fElem + lVar22 * 8 + lVar11 * lVar21) =
                     *(double *)
                      ((long)local_a20.fElem +
                      lVar22 * 8 +
                      local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1018) *
                     local_ee0.fElem[uVar25] +
                     local_dd8.fElem[lVar18 + 10] *
                     *(double *)
                      ((long)local_f78.fElem +
                      lVar22 * 8 +
                      local_f78.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              local_1028 = local_1028 + 1;
              uVar25 = uVar25 + 1;
              lVar19 = lVar19 + 8;
              lVar21 = lVar21 + 8;
            } while (uVar25 != uVar17);
          }
          TPZManVector<long,_10>::~TPZManVector(&local_e48);
          TPZFMatrix<double>::~TPZFMatrix(&local_f78);
          TPZFMatrix<double>::~TPZFMatrix(&local_ee0);
        }
        if (local_fa8.fStore != local_f88) {
          local_fa8.fNAlloc = 0;
          local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_fa8.fStore != (double *)0x0) {
            operator_delete__(local_fa8.fStore);
          }
        }
      }
      lVar18 = lVar18 + 1;
      paiVar20 = paiVar20 + 1;
      local_1018 = local_1018 + 8;
    } while (lVar18 != 4);
    uVar14 = order->fStore[10];
    if (3 < (int)uVar14) {
      uVar16 = uVar14 & 0x7ffffffc;
      uVar14 = uVar14 - 4;
      uVar23 = 0;
      uVar26 = 1;
      uVar27 = 2;
      uVar13 = 3;
      uVar29 = 0;
      uVar32 = 0;
      uVar34 = 0;
      uVar36 = 0;
      do {
        uVar35 = uVar36;
        uVar33 = uVar34;
        uVar31 = uVar32;
        uVar28 = uVar29;
        uVar40 = uVar13;
        uVar39 = uVar27;
        uVar38 = uVar26;
        uVar37 = uVar23;
        auVar30._0_4_ = uVar37 + 1;
        auVar30._4_4_ = uVar38 + 1;
        auVar30._8_4_ = uVar39 + 1;
        auVar30._12_4_ = uVar40 + 1;
        auVar41._4_4_ = uVar38 + 2;
        auVar41._12_4_ = uVar40 + 2;
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        uVar29 = (auVar30._0_4_ * (uVar37 + 2) >> 1) + uVar28;
        uVar32 = ((uint)(auVar41._4_4_ * auVar30._4_4_) >> 1) + uVar31;
        uVar34 = ((uint)((auVar30._8_8_ & 0xffffffff) * (ulong)(uVar39 + 2)) >> 1) + uVar33;
        uVar36 = ((uint)((auVar41._8_8_ & 0xffffffff) * (ulong)auVar30._12_4_) >> 1) + uVar35;
        uVar16 = uVar16 - 4;
        uVar23 = uVar37 + 4;
        uVar26 = uVar38 + 4;
        uVar27 = uVar39 + 4;
        uVar13 = uVar40 + 4;
      } while (uVar16 != 0);
      uVar23 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar37 ^ 0x80000000));
      uVar26 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar38 ^ 0x80000000));
      uVar27 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
      uVar14 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
      uVar14 = (~uVar14 & uVar36 | uVar35 & uVar14) + (~uVar26 & uVar32 | uVar31 & uVar26) +
               (~uVar27 & uVar34 | uVar33 & uVar27) + (~uVar23 & uVar29 | uVar28 & uVar23);
      uVar17 = (ulong)uVar14;
      local_668._32_8_ = local_5d8;
      local_668._16_8_ = 1;
      local_668._24_2_ = 0;
      local_668._0_8_ = &PTR__TPZFMatrix_018b8c30;
      local_668._48_8_ = 0x50;
      local_668._8_8_ = uVar17;
      local_668._40_8_ = local_668._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_668 + 0x38),0);
      local_668._64_8_ = local_610;
      local_668._56_8_ = &PTR__TPZManVector_01815498;
      local_668._72_16_ = (undefined1  [16])0x0;
      local_5f8 = &PTR__TPZVec_01813df0;
      local_5f0 = (undefined1  [16])0x0;
      local_5e0 = 0;
      if (0x50 < uVar14) {
        local_668._32_8_ = operator_new__(uVar17 * 8);
      }
      local_668._0_8_ = &PTR__TPZFNMatrix_018b8940;
      local_348._32_8_ = local_2b8;
      local_348._8_8_ = 3;
      local_348._24_2_ = 0;
      local_348._0_8_ = &PTR__TPZFMatrix_018b8c30;
      local_348._48_8_ = 0x50;
      local_348._16_8_ = uVar17;
      local_348._40_8_ = local_348._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_348 + 0x38),0);
      local_348._64_8_ = local_2f0;
      local_348._56_8_ = &PTR__TPZManVector_01815498;
      local_348._72_16_ = (undefined1  [16])0x0;
      local_2d8 = &PTR__TPZVec_01813df0;
      local_2d0 = (undefined1  [16])0x0;
      local_2c0 = 0;
      if (0x1a < uVar14) {
        local_348._32_8_ = operator_new__(uVar17 * 0x18);
      }
      local_348._0_8_ = &PTR__TPZFNMatrix_018b8940;
      memset((void *)local_668._32_8_,0,local_668._8_8_ * local_668._16_8_ * 8);
      local_668._24_2_ = local_668._24_2_ & 0xff00;
      memset((void *)local_348._32_8_,0,local_348._8_8_ * local_348._16_8_ * 8);
      local_348._24_2_ = local_348._24_2_ & 0xff00;
      ShapeInternal(pt,order->fStore[10],(TPZFMatrix<double> *)local_668,
                    (TPZFMatrix<double> *)local_348);
      local_1018 = (long)(int)local_1028;
      local_1028 = local_1018 * 8;
      lVar18 = 0;
      uVar25 = 0;
      do {
        if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0xf) ||
           (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((long)local_668._8_8_ <= (long)uVar25) || ((long)local_668._16_8_ < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_1018 < 0) ||
            ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1018)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[local_1018] = local_dd8.fElem[0xe] * *(double *)(local_668._32_8_ + uVar25 * 8);
        lVar24 = 0;
        do {
          if ((local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
             (local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0xf)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_668._8_8_ <= (long)uVar25) || ((long)local_668._16_8_ < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0xf) ||
             (local_dd8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_348._8_8_ <= lVar24) || ((long)local_348._16_8_ <= (long)uVar25)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar21 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar21 <= lVar24) || (local_1018 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1018)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)((long)dphi->fElem + lVar24 * 8 + lVar21 * local_1028) =
               local_a20.fElem
               [local_a20.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0xe + lVar24] *
               *(double *)(local_668._32_8_ + uVar25 * 8) +
               local_dd8.fElem[0xe] *
               *(double *)(local_348._32_8_ + lVar24 * 8 + local_348._8_8_ * lVar18);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        local_1018 = local_1018 + 1;
        uVar25 = uVar25 + 1;
        lVar18 = lVar18 + 8;
        local_1028 = local_1028 + 8;
      } while (uVar25 != uVar17);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_348,&PTR_PTR_018b8bf8);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_668,&PTR_PTR_018b8bf8);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_a20,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_dd8,&PTR_PTR_018379a8);
  }
  return;
}

Assistant:

void TPZShapeTetra::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		//  if(order[9]<2) return;
		int shape = 4;
		//rib shapes
		for (int rib = 0; rib < 6; rib++) {
			REAL outval;
			ProjectPoint3dTetraToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int ordin = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToTetra(rib,ordin,dphin);
			for (int i = 0; i < ordin; i++) {
				phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+4) * phin( i, 0) +
					phiblend(rib+4, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[10]<3) return;
		//face shapes
		for (int face = 0; face < 4; face++) {
			if (order[6+face] < 3) continue;
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dTetraToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			//elt->FaceOrder(face,ord1,ord2);
			ord1 = order[6+face];
			//ord2 = ord1;
			if(ord1<3) continue;
			int ordin =  (ord1-2)*(ord1-1)/2;
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(3);
			//	int id0,id1,id2;
			int i;
			for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//    id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			//    id2 = ShapeFaceId[face][2];
			int transid = TPZShapeTriang::GetTransformId2dT(ids);
			outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
			outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..)
			TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			int c = dphin.Cols();
			for(i=0;i<c;i++) {
				dphin(0,i) /= 2.;
				dphin(1,i) /= 2.;
				dphin(2,i) /= 2.;
			}
			TransformDerivativeFromFaceToTetra(face,ordin,dphin);//ord = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+10,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+10) * phin(i ,0) +
					phiblend(face+10, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[10]<4) return;
		//volume shapes
		int totsum = 0,sum;
		int i;
		for(i=0;i<order[10]-3;i++) {
			sum = (i+1)*(i+2) / 2;
			totsum += sum;
		}
		int ord = totsum;
		TPZFNMatrix<80> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[10],phin,dphin);
		for(i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}